

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

void __thiscall duckdb::StringValueScanner::ProcessExtraRow(StringValueScanner *this)

{
  idx_t *piVar1;
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  ulong uVar2;
  byte bVar3;
  CSVState CVar4;
  CSVState CVar5;
  CSVStates *pCVar6;
  CSVBufferHandle *pCVar7;
  CSVStateMachine *pCVar8;
  ulong uVar9;
  StringValueResult *this_01;
  idx_t buffer_pos;
  idx_t *local_38;
  
  this_01 = &this->result;
  StringValueResult::NullPaddingQuotedNewlineCheck(this_01);
  pCVar7 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                     (&(this->super_BaseScanner).cur_buffer_handle);
  uVar9 = pCVar7->actual_size;
  if (uVar9 <= (this->super_BaseScanner).iterator.pos.buffer_pos) {
    return;
  }
  piVar1 = &(this->super_BaseScanner).iterator.pos.buffer_pos;
  this_00 = &(this->super_BaseScanner).state_machine;
  uVar2 = uVar9 - 1;
  local_38 = &(this->super_BaseScanner).lines_read;
  do {
    pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    buffer_pos = (this->super_BaseScanner).iterator.pos.buffer_pos;
    bVar3 = (this->super_BaseScanner).buffer_handle_ptr[buffer_pos];
    CVar4 = (this->super_BaseScanner).states.states[1];
    (this->super_BaseScanner).states.states[0] = CVar4;
    CVar5 = pCVar8->transition_array->state_machine[bVar3][CVar4];
    (this->super_BaseScanner).states.states[1] = CVar5;
    switch(CVar5) {
    case STANDARD:
      do {
        (this->super_BaseScanner).iterator.pos.buffer_pos = buffer_pos + 1;
        pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        buffer_pos = (this->super_BaseScanner).iterator.pos.buffer_pos;
        if (uVar2 <= buffer_pos) break;
      } while (pCVar8->transition_array->skip_standard
               [(byte)(this->super_BaseScanner).buffer_handle_ptr[buffer_pos]] != false);
      goto LAB_017df5cc;
    case DELIMITER:
      StringValueResult::AddValue(this_01,buffer_pos);
      buffer_pos = *piVar1;
      break;
    case RECORD_SEPARATOR:
      if (CVar4 != CARRIAGE_RETURN) {
        if (CVar4 == RECORD_SEPARATOR) goto LAB_017df6d8;
        if ((this->result).super_ScannerResult.comment != true) goto LAB_017df6fd;
        uVar9 = (this->result).super_ScannerResult.last_position.buffer_pos;
        uVar2 = (this->result).position_before_comment;
        if (uVar2 <= uVar9) {
          if ((this->result).cur_col_id == 0) goto LAB_017df71e;
          goto LAB_017df715;
        }
        goto LAB_017df6ab;
      }
      *local_38 = *local_38 + 1;
      break;
    case CARRIAGE_RETURN:
      if (CVar4 == RECORD_SEPARATOR) {
LAB_017df6d8:
        StringValueResult::EmptyLine(this_01,buffer_pos);
      }
      else if ((this->result).super_ScannerResult.comment == true) {
        StringValueResult::UnsetComment(this_01,buffer_pos);
      }
      else {
LAB_017df6fd:
        StringValueResult::AddRow(this_01,buffer_pos);
      }
      goto LAB_017df764;
    case QUOTED:
      if (CVar4 == UNQUOTED) {
        (this->result).super_ScannerResult.escaped = true;
      }
      if ((this_01->super_ScannerResult).quoted == false) {
        (this->result).super_ScannerResult.quoted_position = buffer_pos;
      }
      (this->result).super_ScannerResult.quoted = true;
      (this->result).super_ScannerResult.unquoted = true;
      do {
        (this->super_BaseScanner).iterator.pos.buffer_pos = buffer_pos + 1;
        pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        buffer_pos = (this->super_BaseScanner).iterator.pos.buffer_pos;
        if (uVar2 <= buffer_pos) break;
      } while (pCVar8->transition_array->skip_quoted
               [(byte)(this->super_BaseScanner).buffer_handle_ptr[buffer_pos]] != false);
      goto LAB_017df5cc;
    case UNQUOTED:
      pCVar6 = (this->result).super_ScannerResult.states;
      if (((pCVar6->states[0] == UNQUOTED) && (pCVar6->states[1] == UNQUOTED)) &&
         ((((this->result).super_ScannerResult.state_machine)->dialect_options).
          state_machine_options.escape.value != '\0')) {
        (this->result).super_ScannerResult.escaped = true;
      }
      (this_01->super_ScannerResult).quoted = true;
      break;
    case ESCAPE:
    case UNQUOTED_ESCAPE:
    case ESCAPED_RETURN:
      (this->result).super_ScannerResult.escaped = true;
      break;
    case INVALID:
      StringValueResult::InvalidState(this_01);
      local_38 = piVar1;
      goto LAB_017df76c;
    case QUOTED_NEW_LINE:
      (this->result).quoted_new_line = true;
      StringValueResult::NullPaddingQuotedNewlineCheck(this_01);
      buffer_pos = (this->super_BaseScanner).iterator.pos.buffer_pos;
      break;
    case COMMENT:
      if ((this->result).super_ScannerResult.comment == false) {
        (this->result).position_before_comment = buffer_pos;
        (this->result).super_ScannerResult.comment = true;
      }
      do {
        (this->super_BaseScanner).iterator.pos.buffer_pos = buffer_pos + 1;
        pCVar8 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        buffer_pos = (this->super_BaseScanner).iterator.pos.buffer_pos;
        if (uVar2 <= buffer_pos) break;
      } while (pCVar8->transition_array->skip_comment
               [(byte)(this->super_BaseScanner).buffer_handle_ptr[buffer_pos]] != false);
      goto LAB_017df5cc;
    }
    buffer_pos = buffer_pos + 1;
    *piVar1 = buffer_pos;
LAB_017df5cc:
    if (uVar9 <= buffer_pos) {
      return;
    }
  } while( true );
LAB_017df715:
  StringValueResult::AddRow(this_01,uVar2);
  goto LAB_017df71e;
  while (uVar9 = uVar9 + 1, uVar2 != uVar9) {
LAB_017df6ab:
    if ((this->result).buffer_ptr[uVar9] != ' ') goto LAB_017df715;
  }
LAB_017df71e:
  if ((this->result).number_of_rows == 0) {
    (this->result).first_line_is_comment = true;
  }
  (this->result).super_ScannerResult.comment = false;
  (this->result).super_ScannerResult.last_position.buffer_pos =
       ((((this->result).super_ScannerResult.state_machine)->dialect_options).state_machine_options.
        new_line.value == CARRY_ON) + buffer_pos + 1;
  (this->result).cur_col_id = 0;
  (this->result).chunk_col_id = 0;
LAB_017df764:
  *piVar1 = *piVar1 + 1;
LAB_017df76c:
  *local_38 = *local_38 + 1;
  return;
}

Assistant:

void StringValueScanner::ProcessExtraRow() {
	result.NullPaddingQuotedNewlineCheck();
	idx_t to_pos = cur_buffer_handle->actual_size;
	while (iterator.pos.buffer_pos < to_pos) {
		state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
		switch (states.states[1]) {
		case CSVState::INVALID:
			result.InvalidState(result);
			iterator.pos.buffer_pos++;
			return;
		case CSVState::RECORD_SEPARATOR:
			if (states.states[0] == CSVState::RECORD_SEPARATOR) {
				result.EmptyLine(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				lines_read++;
				return;
			} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
				if (result.IsCommentSet(result)) {
					result.UnsetComment(result, iterator.pos.buffer_pos);
				} else {
					result.AddRow(result, iterator.pos.buffer_pos);
				}
				iterator.pos.buffer_pos++;
				lines_read++;
				return;
			}
			lines_read++;
			iterator.pos.buffer_pos++;
			break;
		case CSVState::CARRIAGE_RETURN:
			if (states.states[0] != CSVState::RECORD_SEPARATOR) {
				if (result.IsCommentSet(result)) {
					result.UnsetComment(result, iterator.pos.buffer_pos);
				} else {
					result.AddRow(result, iterator.pos.buffer_pos);
				}
				iterator.pos.buffer_pos++;
				lines_read++;
				return;
			} else {
				result.EmptyLine(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				lines_read++;
				return;
			}
			break;
		case CSVState::DELIMITER:
			result.AddValue(result, iterator.pos.buffer_pos);
			iterator.pos.buffer_pos++;
			break;
		case CSVState::QUOTED:
			if (states.states[0] == CSVState::UNQUOTED) {
				result.SetEscaped(result);
			}
			result.SetQuoted(result, iterator.pos.buffer_pos);
			iterator.pos.buffer_pos++;
			while (state_machine->transition_array
			           .skip_quoted[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
			       iterator.pos.buffer_pos < to_pos - 1) {
				iterator.pos.buffer_pos++;
			}
			break;
		case CSVState::ESCAPE:
		case CSVState::UNQUOTED_ESCAPE:
		case CSVState::ESCAPED_RETURN:
			result.SetEscaped(result);
			iterator.pos.buffer_pos++;
			break;
		case CSVState::STANDARD:
			iterator.pos.buffer_pos++;
			while (state_machine->transition_array
			           .skip_standard[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
			       iterator.pos.buffer_pos < to_pos - 1) {
				iterator.pos.buffer_pos++;
			}
			break;
		case CSVState::UNQUOTED: {
			result.SetUnquoted(result);
			iterator.pos.buffer_pos++;
			break;
		}
		case CSVState::COMMENT:
			result.SetComment(result, iterator.pos.buffer_pos);
			iterator.pos.buffer_pos++;
			while (state_machine->transition_array
			           .skip_comment[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
			       iterator.pos.buffer_pos < to_pos - 1) {
				iterator.pos.buffer_pos++;
			}
			break;
		case CSVState::QUOTED_NEW_LINE:
			result.quoted_new_line = true;
			result.NullPaddingQuotedNewlineCheck();
			iterator.pos.buffer_pos++;
			break;
		default:
			iterator.pos.buffer_pos++;
			break;
		}
	}
}